

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# envyas.c
# Opt level: O1

void extend(section *s,int add)

{
  int iVar1;
  uint8_t *puVar2;
  int iVar3;
  
  iVar1 = s->maxpos;
  if (iVar1 <= s->pos + add) {
    do {
      iVar3 = iVar1 * 2;
      if (iVar1 == 0) {
        iVar3 = 0x100;
      }
      s->maxpos = iVar3;
      puVar2 = (uint8_t *)realloc(s->code,(long)iVar3);
      s->code = puVar2;
      iVar1 = s->maxpos;
    } while (iVar1 <= s->pos + add);
  }
  return;
}

Assistant:

void extend(struct section *s, int add) {
	while (s->pos + add >= s->maxpos) {
		if (!s->maxpos)
			s->maxpos = 256;
		else
			s->maxpos *= 2;
		s->code = realloc (s->code, s->maxpos);
	}
}